

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
DescriptorKeyInfo_GetExtPrivkeyInformation_root_Test::TestBody
          (DescriptorKeyInfo_GetExtPrivkeyInformation_root_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  AssertHelper local_220;
  Message local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_1;
  Message local_1f8;
  undefined1 local_1f0 [40];
  Message local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar;
  Message local_1a8;
  allocator local_199;
  string local_198 [32];
  undefined1 local_178 [40];
  string key_str;
  string local_130 [8];
  string ext_path_str;
  string local_108 [8];
  string ext_str;
  string local_e0 [8];
  string path;
  ExtPrivkey privkey;
  allocator local_31;
  string local_30 [8];
  string extkey;
  DescriptorKeyInfo_GetExtPrivkeyInformation_root_Test *this_local;
  
  extkey.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "xprv9s21ZrQH143K3h3fDYiay8mocZ3afhfULfb5GX8kCBdno77K4HiA15Tg23wpbeF1pLfs1c5SPmYHrEpTuuRhxMwvKDwqdKiGJS9XFKzUsAF"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)((long)&path.field_2 + 8),local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"m/0\'/1",(allocator *)(ext_str.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::~allocator((allocator<char> *)(ext_str.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_108,"[00000000]",(allocator *)(ext_path_str.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(ext_path_str.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_130,"[00000000/0\'/1]",(allocator *)(key_str.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(key_str.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(local_178 + 0x20));
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,"",&local_199);
      cfd::core::DescriptorKeyInfo::GetExtPrivkeyInformation
                ((ExtPrivkey *)local_178,(string *)(path.field_2._M_local_buf + 8));
      std::__cxx11::string::operator=((string *)(local_178 + 0x20),(string *)local_178);
      std::__cxx11::string::~string((string *)local_178);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
    }
  }
  else {
    testing::Message::Message(&local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x5ef,
               "Expected: key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, \"\") doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_1a8);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1c0,"key_str.c_str()","ext_str.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_1f0 + 0x20),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x5f0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_1f0 + 0x20),&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_1f0 + 0x20));
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorKeyInfo::GetExtPrivkeyInformation
                ((ExtPrivkey *)local_1f0,(string *)(path.field_2._M_local_buf + 8));
      std::__cxx11::string::operator=((string *)(local_178 + 0x20),(string *)local_1f0);
      std::__cxx11::string::~string((string *)local_1f0);
    }
  }
  else {
    testing::Message::Message(&local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x5f2,
               "Expected: key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, path) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1f8);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_210,"key_str.c_str()","ext_path_str.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_descriptor.cpp"
               ,0x5f3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  std::__cxx11::string::~string((string *)(local_178 + 0x20));
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_e0);
  cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)((long)&path.field_2 + 8));
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(DescriptorKeyInfo, GetExtPrivkeyInformation_root) {
  std::string extkey = "xprv9s21ZrQH143K3h3fDYiay8mocZ3afhfULfb5GX8kCBdno77K4HiA15Tg23wpbeF1pLfs1c5SPmYHrEpTuuRhxMwvKDwqdKiGJS9XFKzUsAF";
  ExtPrivkey privkey(extkey);
  std::string path = "m/0'/1";
  std::string ext_str = "[00000000]";
  std::string ext_path_str = "[00000000/0'/1]";
  std::string key_str;

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, ""));
  EXPECT_STREQ(key_str.c_str(), ext_str.c_str());

  EXPECT_NO_THROW(key_str = DescriptorKeyInfo::GetExtPrivkeyInformation(privkey, path));
  EXPECT_STREQ(key_str.c_str(), ext_path_str.c_str());
}